

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_2::InMemoryEnv::RemoveFile(InMemoryEnv *this,string *fname)

{
  bool bVar1;
  Mutex *in_RDX;
  Slice local_58;
  Slice local_48;
  _Self local_38;
  _Self local_30;
  MutexLock local_28;
  MutexLock lock;
  string *fname_local;
  InMemoryEnv *this_local;
  
  lock.mu_ = in_RDX;
  MutexLock::MutexLock(&local_28,(Mutex *)&fname->field_2);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
               *)((long)&fname[1].field_2 + 8),(key_type *)lock.mu_);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
              *)((long)&fname[1].field_2 + 8));
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    Slice::Slice(&local_48,(string *)lock.mu_);
    Slice::Slice(&local_58,"File not found");
    Status::IOError((Status *)this,&local_48,&local_58);
  }
  else {
    RemoveFileInternal((InMemoryEnv *)fname,(string *)lock.mu_);
    Status::OK();
  }
  MutexLock::~MutexLock(&local_28);
  return (Status)(char *)this;
}

Assistant:

Status RemoveFile(const std::string& fname) override {
    MutexLock lock(&mutex_);
    if (file_map_.find(fname) == file_map_.end()) {
      return Status::IOError(fname, "File not found");
    }

    RemoveFileInternal(fname);
    return Status::OK();
  }